

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O2

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
expand(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
      SearchVertexPtr *vertex)

{
  Heap<double> *pHVar1;
  pointer psVar2;
  pointer pHVar3;
  element_type *peVar4;
  undefined8 *puVar5;
  int iVar6;
  element_type *peVar7;
  iterator iVar8;
  long lVar9;
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  *__r_00;
  long lVar12;
  Heap<double> *this_00;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  SearchVertexPtr vertex_copy;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  vertex_successors;
  Ptr local_f8;
  value_type local_e8;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  local_48;
  
  peVar7 = (vertex->
           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if ((peVar7->super_Element).heap_index_ != -1) {
    pHVar1 = &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).open_;
    std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
              (local_78,&vertex->
                         super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              );
    csbpl_common::Heap<double>::decreaseKey(pHVar1,(Ptr *)local_78,-INFINITY);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    csbpl_common::Heap<double>::remove((Heap<double> *)(local_68 + 0x10),(char *)pHVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    peVar7 = (vertex->
             super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    (peVar7->super_Element).key_ = INFINITY;
  }
  lVar12 = 0;
  lVar11 = 0;
  for (lVar9 = 0;
      lVar9 < (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.num_inad_; lVar9 = lVar9 + 1) {
    psVar2 = (peVar7->mha_copy_).
             super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)(*(long *)((long)&psVar2->
                                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                          + lVar11) + 8) != -1) {
      pHVar3 = (this->open_inad_).
               super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                (local_88,(__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                           *)((long)&psVar2->
                                     super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                             + lVar11));
      csbpl_common::Heap<double>::decreaseKey
                ((Heap<double> *)
                 ((long)&(pHVar3->data_).
                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                         ._M_impl + lVar12),(Ptr *)local_88,-INFINITY);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
      csbpl_common::Heap<double>::remove
                ((Heap<double> *)local_68,
                 (char *)((long)&(((this->open_inad_).
                                   super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->data_).
                                 super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                 ._M_impl + lVar12));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      peVar7 = (vertex->
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      **(undefined8 **)
        ((long)&((peVar7->mha_copy_).
                 super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        + lVar11) = 0x7ff0000000000000;
    }
    lVar11 = lVar11 + 0x10;
    lVar12 = lVar12 + 0x18;
  }
  sliding_puzzle::SlidingPuzzle::getValidSuccessors
            (&local_48,
             (this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).env_ptr_.
             super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             vertex);
  pHVar1 = &(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).open_;
  __r_00 = &(local_48.
             super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ;
  do {
    peVar7 = __r_00->_M_ptr;
    if ((peVar7->mha_copy_).
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (peVar7->mha_copy_).
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar9 = 0;
      for (lVar11 = 0;
          lVar11 < (this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                   ).params_.num_inad_; lVar11 = lVar11 + 1) {
        std::
        make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
                  ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&local_e8);
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back(&__r_00->_M_ptr->mha_copy_,&local_e8);
        std::
        __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=((__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                     *)(*(long *)((long)&(((__r_00->_M_ptr->mha_copy_).
                                           super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar9) + 0x48),__r_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e8.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        lVar9 = lVar9 + 0x10;
      }
      peVar7 = __r_00->_M_ptr;
    }
    peVar4 = (vertex->
             super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    dVar15 = peVar4->g_cost_;
    iVar6 = sliding_puzzle::SlidingPuzzle::getCostToSuccessor
                      ((this->
                       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                       ).env_ptr_.
                       super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&peVar4->state_,&peVar7->state_);
    dVar15 = dVar15 + (double)iVar6;
    peVar7 = __r_00->_M_ptr;
    if (dVar15 < peVar7->g_cost_) {
      peVar7->g_cost_ = dVar15;
      std::
      __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&(peVar7->parent_vertex_).
                   super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ,&vertex->
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 );
      peVar7 = __r_00->_M_ptr;
      peVar7->root_id_ =
           ((vertex->
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->root_id_;
      peVar7->depth_ =
           ((peVar7->parent_vertex_).
            super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->depth_ + 1;
      iVar8 = std::
              _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).closed_._M_h,&peVar7->state_);
      peVar7 = __r_00->_M_ptr;
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
          ._M_cur == (__node_type *)0x0) {
        dVar15 = peVar7->g_cost_;
        dVar16 = (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.eps_;
        dVar13 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost
                           ((this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,&peVar7->state_);
        dVar15 = dVar16 * dVar13 + dVar15;
        peVar7 = __r_00->_M_ptr;
        (peVar7->super_Element).key_ = INFINITY;
        if ((peVar7->super_Element).heap_index_ == -1) {
          std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                    (local_98,__r_00);
          csbpl_common::Heap<double>::insert(pHVar1,(Ptr *)local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
          std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                    (local_a8,__r_00);
          csbpl_common::Heap<double>::decreaseKey(pHVar1,(Ptr *)local_a8,dVar15);
          p_Var10 = &local_a0;
        }
        else {
          std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                    (local_b8,__r_00);
          csbpl_common::Heap<double>::decreaseKey(pHVar1,(Ptr *)local_b8,dVar15);
          p_Var10 = &local_b0;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var10);
        iVar8 = std::
                _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->closed_inad_)._M_h,&__r_00->_M_ptr->state_);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
            ._M_cur == (__node_type *)0x0) {
          lVar12 = 0;
          lVar11 = 0;
          for (lVar9 = 0;
              lVar9 < (this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).params_.num_inad_; lVar9 = lVar9 + 1) {
            dVar16 = __r_00->_M_ptr->g_cost_;
            dVar13 = (this->
                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                     ).params_.eps_;
            dVar14 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                               ((this->
                                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                ).env_ptr_.
                                super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,&__r_00->_M_ptr->state_,(int)lVar9);
            dVar16 = dVar13 * dVar14 + dVar16;
            if (dVar16 <= (this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).params_.mha_eps_ * dVar15) {
              psVar2 = (__r_00->_M_ptr->mha_copy_).
                       super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar5 = *(undefined8 **)
                        ((long)&(psVar2->
                                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar11);
              __r = (__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                     *)((long)&(psVar2->
                               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar11);
              *puVar5 = 0x7ff0000000000000;
              this_00 = (Heap<double> *)
                        ((long)&(((this->open_inad_).
                                  super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data_).
                                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                ._M_impl + lVar12);
              if (*(int *)(puVar5 + 1) == -1) {
                std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                          (local_c8,__r);
                csbpl_common::Heap<double>::insert(this_00,(Ptr *)local_c8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
                pHVar3 = (this->open_inad_).
                         super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                          (local_d8,(__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                     *)((long)&(((__r_00->_M_ptr->mha_copy_).
                                                 super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + lVar11));
                csbpl_common::Heap<double>::decreaseKey
                          ((Heap<double> *)
                           ((long)&(pHVar3->data_).
                                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                   ._M_impl + lVar12),(Ptr *)local_d8,dVar16);
                p_Var10 = &local_d0;
              }
              else {
                std::__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                          ((__shared_ptr<csbpl_common::Heap<double>::Element,(__gnu_cxx::_Lock_policy)2>
                            *)&local_f8,__r);
                csbpl_common::Heap<double>::decreaseKey(this_00,&local_f8,dVar16);
                p_Var10 = &local_f8.
                           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var10);
            }
            lVar11 = lVar11 + 0x10;
            lVar12 = lVar12 + 0x18;
          }
        }
        else {
          std::
          vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
          ::push_back(&this->incons_inad_,&__r_00->_M_ptr->state_);
        }
      }
      else {
        std::
        vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
        ::push_back(&this->incons_,&peVar7->state_);
        std::
        vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
        ::push_back(&this->incons_inad_,&__r_00->_M_ptr->state_);
      }
    }
    __r_00 = __r_00 + 1;
  } while( true );
}

Assistant:

virtual bool expand(SearchVertexPtr& vertex)
    {
      if (vertex->heap_index_ != -1)
      {
        this->open_.decreaseKey(vertex,
                                -std::numeric_limits<double>::infinity());
        this->open_.remove();
        vertex->key_ = std::numeric_limits<double>::infinity();
      }
      
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        if (vertex->mha_copy_[i]->heap_index_ != -1)
        {
          open_inad_[i].decreaseKey(vertex->mha_copy_[i],
                                    -std::numeric_limits<double>::infinity());
          open_inad_[i].remove();
          vertex->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
        }
      }
      
      std::vector<SearchVertexPtr> vertex_successors =
        this->env_ptr_->getValidSuccessors(vertex);
      
      for(const SearchVertexPtr &successor : vertex_successors)
      {
        if (successor->mha_copy_.empty())
        {
          for (int i=0; i<this->params_.num_inad_; ++i)
          {
            SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(successor->state_);
            successor->mha_copy_.push_back(vertex_copy);
            successor->mha_copy_[i]->self_ptr_ = successor;
          }
        }
        
        double new_cost = vertex->g_cost_ +
                          this->env_ptr_->getCostToSuccessor(vertex->state_,
                                                             successor->state_);
        
        if (new_cost < successor->g_cost_)
        {
          successor->g_cost_ = new_cost;
          successor->parent_vertex_ = vertex;
          successor->root_id_ = vertex->root_id_;
          successor->depth_ = successor->parent_vertex_->depth_ + 1;
          
          if (this->closed_.find(successor->state_) != this->closed_.end())
          {
            incons_.push_back(successor->state_);
            incons_inad_.push_back(successor->state_);
          }
          else
          {
            // Insert/Update in OPEN_0 with admissible heuristic
            double f_cost_ad = successor->g_cost_ +
                               this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(successor->state_);
            if (successor->heap_index_ == -1)
            {
              successor->key_ = std::numeric_limits<double>::infinity();
              this->open_.insert(successor);
              this->open_.decreaseKey(successor,
                                      f_cost_ad);
            }
            else
            {
              successor->key_ = std::numeric_limits<double>::infinity();
              this->open_.decreaseKey(successor,
                                      f_cost_ad);
            }
            
            if (closed_inad_.find(successor->state_) != closed_inad_.end())
            {
              incons_inad_.push_back(successor->state_);
            }
            else
            {
              for (int i=0; i<this->params_.num_inad_; ++i)
              {
                double f_cost_inad = successor->g_cost_ +
                                     this->params_.eps_*
                                     this->env_ptr_->getInadmissibleHeuristicCost(successor->state_, i);
                
                if (f_cost_inad <= this->params_.mha_eps_*f_cost_ad)
                {
                  if (successor->mha_copy_[i]->heap_index_ == -1)
                  {
                    successor->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
                    open_inad_[i].insert(successor->mha_copy_[i]);
                    open_inad_[i].decreaseKey(successor->mha_copy_[i],
                                              f_cost_inad);
                  }
                  else
                  {
                    successor->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
                    open_inad_[i].decreaseKey(successor->mha_copy_[i],
                                              f_cost_inad);
                  }
                }
              }
            }
          }
        }
      }
    }